

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O3

int __thiscall CAPSFile::WriteToBuffer(CAPSFile *this,uchar *buffer,uint size_of_buffer)

{
  undefined4 uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  pointer __src;
  uchar *puVar11;
  pointer paVar12;
  int base_offset;
  int iVar13;
  undefined1 auVar14 [16];
  
  uVar7 = (*this->_vptr_CAPSFile[5])();
  iVar10 = -1;
  if (uVar7 <= size_of_buffer) {
    uVar7 = (this->caps_header_).length;
    uVar8 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    memcpy(buffer,&this->caps_header_,(long)(int)uVar8);
    uVar7 = (this->caps_info_).header.length;
    uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    memcpy(buffer + (int)uVar8,&this->caps_info_,(long)(int)uVar7);
    iVar13 = uVar7 + uVar8;
    __src = (this->list_imge_).
            super__Vector_base<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>._M_impl.
            super__Vector_impl_data._M_start;
    if (__src != (this->list_imge_).
                 super__Vector_base<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>._M_impl
                 .super__Vector_impl_data._M_finish) {
      do {
        (__src->header).crc = 0;
        uVar7 = (__src->header).length;
        puVar11 = buffer + iVar13;
        memcpy(puVar11,__src,(long)(int)uVar7);
        if (uVar7 - 4 != 0) {
          uVar9 = 0;
          do {
            uVar1 = *(undefined4 *)(puVar11 + uVar9 + 4);
            auVar14 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte
                                                  )((uint)uVar1 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar1 >> 0x10),uVar1)) >>
                                                  0x20),uVar1) >> 0x18),(char)((uint)uVar1 >> 8)),
                                       (ushort)(byte)uVar1) & 0xffffff00ffffff);
            auVar14 = pshuflw(auVar14,auVar14,0x1b);
            sVar2 = auVar14._0_2_;
            sVar3 = auVar14._2_2_;
            sVar4 = auVar14._4_2_;
            sVar5 = auVar14._6_2_;
            *(uint *)(puVar11 + uVar9 + 4) =
                 CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar14[6] - (0xff < sVar5),
                          CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar14[4] - (0xff < sVar4),
                                   CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar14[2] -
                                            (0xff < sVar3),
                                            (0 < sVar2) * (sVar2 < 0x100) * auVar14[0] -
                                            (0xff < sVar2))));
            uVar9 = uVar9 + 4;
          } while (uVar9 < uVar7 - 4);
        }
        uVar8 = CRC::ComputeCrc32(0xedb88320,puVar11,uVar7);
        *(uint *)(puVar11 + 8) =
             uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
        iVar13 = iVar13 + uVar7;
        __src = __src + 1;
      } while (__src != (this->list_imge_).
                        super__Vector_base<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
    }
    paVar12 = (this->list_data_).
              super__Vector_base<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>.
              _M_impl.super__Vector_impl_data._M_start;
    iVar10 = 0;
    if (paVar12 !=
        (this->list_data_).
        super__Vector_base<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        uVar7 = (paVar12->header).length;
        if (3 < uVar7) {
          (paVar12->header).crc = 0;
          puVar11 = buffer + iVar13;
          uVar6 = *(undefined8 *)&paVar12->data_crc;
          *(undefined8 *)(buffer + (long)iVar13 + 0xc) = *(undefined8 *)&paVar12->size;
          *(undefined8 *)(buffer + (long)iVar13 + 0xc + 8) = uVar6;
          uVar6 = *(undefined8 *)&(paVar12->header).crc;
          *(undefined8 *)(buffer + iVar13) = *(undefined8 *)&paVar12->header;
          *(undefined8 *)(buffer + iVar13 + 8) = uVar6;
          uVar9 = 0xfffffffffffffffc;
          do {
            uVar1 = *(undefined4 *)(puVar11 + uVar9 + 8);
            auVar14 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte
                                                  )((uint)uVar1 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar1 >> 0x10),uVar1)) >>
                                                  0x20),uVar1) >> 0x18),(char)((uint)uVar1 >> 8)),
                                       (ushort)(byte)uVar1) & 0xffffff00ffffff);
            auVar14 = pshuflw(auVar14,auVar14,0x1b);
            sVar2 = auVar14._0_2_;
            sVar3 = auVar14._2_2_;
            sVar4 = auVar14._4_2_;
            sVar5 = auVar14._6_2_;
            *(uint *)(puVar11 + uVar9 + 8) =
                 CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar14[6] - (0xff < sVar5),
                          CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar14[4] - (0xff < sVar4),
                                   CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar14[2] -
                                            (0xff < sVar3),
                                            (0 < sVar2) * (sVar2 < 0x100) * auVar14[0] -
                                            (0xff < sVar2))));
            uVar9 = uVar9 + 4;
          } while (uVar9 < 0x14);
          memcpy(buffer + (iVar13 + 0x1c),paVar12->buffer,(ulong)paVar12->size);
          iVar13 = iVar13 + 0x1c + paVar12->size;
          uVar7 = CRC::ComputeCrc32(0xedb88320,puVar11,uVar7);
          *(uint *)(puVar11 + 8) =
               uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
        }
        if (paVar12->buffer != (uchar *)0x0) {
          operator_delete__(paVar12->buffer);
        }
        paVar12->buffer = (uchar *)0x0;
        paVar12 = paVar12 + 1;
      } while (paVar12 !=
               (this->list_data_).
               super__Vector_base<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return iVar10;
}

Assistant:

int CAPSFile::WriteToBuffer(unsigned char* buffer, unsigned int size_of_buffer)
{
   // Write header
   int offset = 0;

   if (size_of_buffer < ComputeSize())
      return -1;

   int size = SwapInt(caps_header_.length);
   memcpy(&buffer[offset], &caps_header_, size);
   offset += size;

   // Write INFO
   size = SwapInt(caps_info_.header.length);
   memcpy(&buffer[offset], &caps_info_, size);
   offset += size;

   // Write IMGE
   for (std::vector<ImgeItem>::iterator it = list_imge_.begin(); it != list_imge_.end(); ++it)
   {
      int base_offset = offset;
      it->header.crc = 0;
      int lg = it->header.length;
      memcpy(&buffer[offset], &(*it), lg);
      Swap(&buffer[offset + 4], lg - 4);
      unsigned int crc = SwapInt(CRC::ComputeCrc32(0xEDB88320, &buffer[base_offset], lg));
      memcpy(&buffer[offset + 8], &crc, 4);
      offset += lg;
   }

   // Write DATA
   for (std::vector<DataChunks>::iterator it = list_data_.begin(); it != list_data_.end(); ++it)
   {
      if (it->header.length >= 4)
      {
         // datablock
         int base_offset = offset;
         it->header.crc = 0;
         int lg = it->header.length;

         memcpy(&buffer[offset], &(*it), sizeof(DataChunks) - sizeof(unsigned char*));
         Swap(&buffer[offset + 4], sizeof(DataChunks) - (4+ sizeof(unsigned char*)));
         offset += sizeof(DataChunks) - sizeof(unsigned char*);

         memcpy(&buffer[offset], it->buffer, it->size);
         offset += it->size;

         unsigned int crc = SwapInt(CRC::ComputeCrc32(0xEDB88320, &buffer[base_offset], lg));
         memcpy(&buffer[base_offset + 8], &crc, 4);
      }
      delete[]it->buffer;
      it->buffer = NULL;
   }

   return 0;
}